

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O0

parser_error parse_chest_trap_name(parser *p)

{
  char *pcVar1;
  undefined8 *puVar2;
  chest_trap *v;
  chest_trap *t;
  chest_trap *h;
  char *name;
  parser *p_local;
  
  pcVar1 = parser_getstr(p,"name");
  puVar2 = (undefined8 *)parser_priv(p);
  v = (chest_trap *)mem_zalloc(0x40);
  if (puVar2 == (undefined8 *)0x0) {
    chest_traps = v;
    v->pval = L'\x01';
  }
  else {
    *puVar2 = v;
    v->pval = *(int *)(puVar2 + 5) << 1;
  }
  pcVar1 = string_make(pcVar1);
  v->name = pcVar1;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_chest_trap_name(struct parser *p)
{
    const char *name = parser_getstr(p, "name");
    struct chest_trap *h = parser_priv(p);
    struct chest_trap *t = mem_zalloc(sizeof *t);

	/* Order the traps correctly and set the pval */
	if (h) {
		h->next = t;
		t->pval = h->pval * 2;
	} else {
		chest_traps = t;
		t->pval = 1;
	}
    t->name = string_make(name);
    parser_setpriv(p, t);
    return PARSE_ERROR_NONE;
}